

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O2

void fe_write_frame(fe_t *fe,mfcc_t *feat,int32 store_pcm)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  double *pdVar4;
  powspec_t *ppVar5;
  melfb_t *pmVar6;
  powspec_t *ppVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  powspec_t *spec;
  int iVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  ushort uVar17;
  ulong uVar18;
  ulong uVar19;
  double *pdVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  int32 is_speech;
  mfcc_t *local_58;
  double *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  pdVar4 = (double *)fe->frame;
  bVar1 = fe->fft_order;
  iVar9 = (int)fe->fft_size;
  iVar13 = 1;
  if (1 < iVar9) {
    iVar13 = iVar9;
  }
  iVar23 = 0;
  for (uVar19 = 0; uVar19 != iVar13 - 1; uVar19 = uVar19 + 1) {
    lVar11 = (long)iVar23;
    iVar10 = iVar9;
    if ((long)uVar19 < lVar11) {
      dVar28 = pdVar4[lVar11];
      pdVar4[lVar11] = pdVar4[uVar19];
      pdVar4[uVar19] = dVar28;
    }
    do {
      iVar21 = iVar23;
      iVar10 = iVar10 / 2;
      iVar23 = iVar21 - iVar10;
    } while (iVar10 <= iVar21);
    iVar23 = iVar21 + iVar10;
  }
  lVar11 = (long)iVar9;
  for (lVar12 = 0; lVar12 < lVar11; lVar12 = lVar12 + 2) {
    dVar28 = pdVar4[lVar12];
    pdVar4[lVar12] = dVar28 + pdVar4[lVar12 + 1];
    pdVar4[lVar12 + 1] = dVar28 - pdVar4[lVar12 + 1];
  }
  uVar22 = 1;
  while (uVar22 < bVar1) {
    bVar8 = (byte)uVar22;
    iVar13 = 1 << (bVar8 & 0x1f);
    uVar22 = uVar22 + 1;
    uVar24 = 2 << (bVar8 & 0x1f);
    local_38 = (ulong)uVar24;
    lVar12 = (long)(1 << (bVar8 - 1 & 0x1f));
    local_40 = (long)(int)uVar24;
    local_48 = (long)iVar13;
    local_50 = pdVar4 + lVar12;
    pdVar20 = pdVar4 + local_48;
    lVar25 = (ulong)(iVar13 * 2 - 2) + 1;
    pdVar16 = pdVar4;
    for (lVar27 = 0; lVar27 < lVar11; lVar27 = lVar27 + local_40) {
      dVar28 = pdVar4[lVar27];
      lVar14 = local_48 + lVar27;
      dVar29 = pdVar4[lVar14];
      pdVar4[lVar27] = dVar28 + dVar29;
      pdVar4[lVar14] = dVar28 - dVar29;
      local_50[lVar14] = -local_50[lVar14];
      lVar15 = 0;
      for (lVar14 = 1; lVar14 < lVar12; lVar14 = lVar14 + 1) {
        iVar23 = (int)lVar25 + (int)lVar15;
        iVar13 = (int)lVar14 << (bVar1 - (char)uVar22 & 0x1f);
        dVar30 = pdVar20[lVar14] * (double)fe->ccc[iVar13] +
                 (double)fe->sss[iVar13] * pdVar4[iVar23];
        dVar29 = pdVar20[lVar14] * (double)fe->sss[iVar13] -
                 (double)fe->ccc[iVar13] * pdVar4[iVar23];
        dVar28 = pdVar20[lVar15 + -1];
        pdVar4[iVar23] = dVar28 - dVar29;
        pdVar20[lVar14] = -dVar28 - dVar29;
        pdVar20[lVar15 + -1] = pdVar16[lVar14] - dVar30;
        pdVar16[lVar14] = dVar30 + pdVar16[lVar14];
        lVar15 = lVar15 + -1;
      }
      pdVar16 = pdVar16 + local_40;
      pdVar20 = pdVar20 + local_40;
      lVar25 = lVar25 + local_38;
    }
  }
  ppVar5 = fe->spec;
  *ppVar5 = (powspec_t)(*pdVar4 * *pdVar4);
  pdVar16 = pdVar4 + lVar11 + -1;
  for (lVar11 = 1; lVar11 <= iVar9 / 2; lVar11 = lVar11 + 1) {
    ppVar5[lVar11] = (powspec_t)(pdVar4[lVar11] * pdVar4[lVar11] + *pdVar16 * *pdVar16);
    pdVar16 = pdVar16 + -1;
  }
  pmVar6 = fe->mel_fb;
  ppVar7 = fe->mfspec;
  uVar19 = (ulong)(uint)pmVar6->num_filters;
  if (pmVar6->num_filters < 1) {
    uVar19 = 0;
  }
  for (uVar26 = 0; uVar26 != uVar19; uVar26 = uVar26 + 1) {
    sVar2 = pmVar6->spec_start[uVar26];
    sVar3 = pmVar6->filt_start[uVar26];
    ppVar7[uVar26] = 0.0;
    uVar17 = pmVar6->filt_width[uVar26];
    if ((short)uVar17 < 1) {
      uVar17 = 0;
    }
    dVar28 = 0.0;
    for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
      dVar28 = dVar28 + (double)(float)pmVar6->filt_coeffs[(long)sVar3 + uVar18] *
                        (double)ppVar5[(long)sVar2 + uVar18];
      ppVar7[uVar26] = (powspec_t)dVar28;
    }
  }
  local_58 = feat;
  fe_track_snr(fe,&is_speech);
  ppVar5 = fe->mfspec;
  for (lVar11 = 0; lVar11 < fe->mel_fb->num_filters; lVar11 = lVar11 + 1) {
    dVar28 = log((double)ppVar5[lVar11] + 0.0001);
    ppVar5[lVar11] = (powspec_t)dVar28;
  }
  if (fe->log_spec == '\x02') {
    fe_dct2(fe,ppVar5,feat,0);
    fe_dct3(fe,feat,ppVar5);
    bVar1 = fe->feature_dimension;
    for (uVar19 = 0; bVar1 != uVar19; uVar19 = uVar19 + 1) {
      feat[uVar19] = (mfcc_t)(float)(double)ppVar5[uVar19];
    }
  }
  else if (fe->log_spec == '\x01') {
    bVar1 = fe->feature_dimension;
    for (uVar19 = 0; bVar1 != uVar19; uVar19 = uVar19 + 1) {
      feat[uVar19] = (mfcc_t)(float)(double)ppVar5[uVar19];
    }
  }
  else {
    if (fe->transform == '\x02') {
      iVar13 = 1;
    }
    else {
      if (fe->transform != '\x01') {
        fe_spec2cep(fe,ppVar5,feat);
        goto LAB_001102bc;
      }
      iVar13 = 0;
    }
    fe_dct2(fe,ppVar5,feat,iVar13);
  }
LAB_001102bc:
  fe_lifter(fe,feat);
  fe_vad_hangover(fe,feat,is_speech,store_pcm);
  return;
}

Assistant:

void
fe_write_frame(fe_t * fe, mfcc_t * feat, int32 store_pcm)
{
    int32 is_speech;

    fe_spec_magnitude(fe);
    fe_mel_spec(fe);
    fe_track_snr(fe, &is_speech);
    fe_mel_cep(fe, feat);
    fe_lifter(fe, feat);
    fe_vad_hangover(fe, feat, is_speech, store_pcm);
}